

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser_cpp_test.cc
# Opt level: O1

void __thiscall
ctemplate_htmlparser::HtmlparserCppTest::ValidateValue
          (HtmlparserCppTest *this,string *expected_value)

{
  _Rb_tree_header *p_Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  size_t sVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  string *psVar6;
  HtmlparserCppTest *pHVar7;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  char *extraout_RAX;
  char *extraout_RAX_00;
  char *extraout_RAX_01;
  int *piVar8;
  HtmlParser *this_00;
  const_iterator cVar9;
  mapped_type *ppHVar10;
  undefined8 extraout_RAX_02;
  undefined7 uVar11;
  ulong uVar12;
  htmlparser_ctx *phVar13;
  undefined1 *puVar14;
  undefined1 *puVar15;
  HtmlparserCppTest *pHVar16;
  htmlparser_ctx_s *phVar17;
  _Base_ptr p_Var18;
  _Base_ptr p_Var19;
  pointer this_01;
  _Base_ptr unaff_R12;
  pointer str_00;
  _Base_ptr unaff_R15;
  string parsed_state;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vStack_1e0;
  _Base_ptr p_Stack_1c8;
  _Base_ptr p_Stack_1c0;
  undefined1 auStack_180 [16];
  _Base_ptr p_Stack_170;
  HtmlparserCppTest *pHStack_168;
  _Base_ptr p_Stack_160;
  undefined1 auStack_158 [16];
  _Base_ptr p_Stack_148;
  HtmlparserCppTest *pHStack_140;
  _Base_ptr p_Stack_138;
  char *pcStack_130;
  HtmlParser HStack_128;
  allocator aStack_e9;
  HtmlparserCppTest *pHStack_e8;
  size_t sStack_e0;
  HtmlparserCppTest HStack_d8;
  HtmlparserCppTest *pHStack_98;
  ulong uStack_90;
  string *psStack_80;
  allocator aStack_69;
  HtmlparserCppTest *pHStack_68;
  size_t sStack_60;
  undefined1 auStack_58 [40];
  string *local_30;
  HtmlParser local_28;
  
  pHVar16 = (HtmlparserCppTest *)(this->parser_).parser_;
  auStack_58._24_8_ = (_Base_ptr)0x107056;
  psVar6 = expected_value;
  lVar5 = ctemplate_htmlparser::htmlparser_value((htmlparser_ctx_s *)pHVar16);
  if (lVar5 != 0) {
    auStack_58._24_8_ = (_Base_ptr)0x107064;
    psVar6 = (string *)ctemplate_htmlparser::htmlparser_value((this->parser_).parser_);
    this = (HtmlparserCppTest *)&local_30;
    auStack_58._24_8_ = (_Base_ptr)0x107079;
    pHVar16 = this;
    std::__cxx11::string::string((string *)this,(char *)psVar6,(allocator *)(auStack_58 + 0x27));
    phVar13 = (htmlparser_ctx *)expected_value->_M_string_length;
    if (phVar13 == local_28.parser_) {
      if (phVar13 == (htmlparser_ctx *)0x0) {
LAB_00107099:
        if (local_30 != (string *)&stack0xffffffffffffffe0) {
          auStack_58._24_8_ = (_Base_ptr)0x1070ac;
          operator_delete(local_30);
        }
        return;
      }
      pHVar16 = (HtmlparserCppTest *)(expected_value->_M_dataplus)._M_p;
      auStack_58._24_8_ = (_Base_ptr)0x107095;
      psVar6 = local_30;
      iVar4 = bcmp(pHVar16,local_30,(size_t)phVar13);
      if (iVar4 == 0) goto LAB_00107099;
    }
    auStack_58._24_8_ = (_Base_ptr)0x1070b9;
    ValidateValue();
  }
  auStack_58._24_8_ = ValidateAttributeType;
  ValidateValue();
  auStack_58._24_8_ = this;
  auStack_58._16_8_ = expected_value;
  pHVar16 = (HtmlparserCppTest *)(pHVar16->parser_).parser_;
  iVar4 = ctemplate_htmlparser::htmlparser_attr_type((htmlparser_ctx_s *)pHVar16);
  puVar14 = kAttributeTypeMap;
  pHVar7 = (HtmlparserCppTest *)IdToName(pHVar16,(IdNameMap *)kAttributeTypeMap,iVar4);
  if (psVar6->_M_string_length == 0) {
    ValidateAttributeType();
  }
  else {
    this = (HtmlparserCppTest *)&pHStack_68;
    std::__cxx11::string::string((string *)this,(char *)pHVar7,&aStack_69);
    sVar2 = psVar6->_M_string_length;
    puVar14 = (undefined1 *)pHVar7;
    if (sVar2 == sStack_60) {
      uVar11 = (undefined7)((ulong)psVar6 >> 8);
      if (sVar2 == 0) {
        psVar6 = (string *)CONCAT71(uVar11,1);
      }
      else {
        puVar14 = (undefined1 *)pHStack_68;
        iVar4 = bcmp((psVar6->_M_dataplus)._M_p,pHStack_68,sVar2);
        psVar6 = (string *)CONCAT71(uVar11,iVar4 == 0);
      }
    }
    else {
      psVar6 = (string *)0x0;
    }
    if (pHStack_68 != (HtmlparserCppTest *)auStack_58) {
      operator_delete(pHStack_68);
    }
    pHVar16 = pHStack_68;
    if ((char)psVar6 != '\0') {
      return;
    }
  }
  ValidateAttributeType();
  uStack_90 = 0x10715c;
  psStack_80 = psVar6;
  bVar3 = StringToBool((string *)puVar14);
  uVar12 = CONCAT71(extraout_var,bVar3) & 0xffffffff;
  phVar17 = (pHVar16->parser_).parser_;
  uStack_90 = 0x107167;
  iVar4 = ctemplate_htmlparser::htmlparser_is_attr_quoted(phVar17);
  if (SUB81(uVar12,0) == (iVar4 != 0)) {
    return;
  }
  uStack_90 = 0x10717d;
  ValidateAttributeQuoted();
  HStack_d8.parser_.parser_ = (htmlparser_ctx *)0x10718c;
  pHStack_98 = pHVar16;
  uStack_90 = uVar12;
  bVar3 = StringToBool((string *)puVar14);
  phVar13 = (htmlparser_ctx *)(CONCAT71(extraout_var_00,bVar3) & 0xffffffff);
  p_Var18 = *(_Base_ptr *)(phVar17 + 0x30);
  HStack_d8.parser_.parser_ = (htmlparser_ctx *)0x107197;
  iVar4 = ctemplate_htmlparser::htmlparser_in_js((htmlparser_ctx_s *)p_Var18);
  if (SUB81(phVar13,0) == (iVar4 != 0)) {
    return;
  }
  HStack_d8.parser_.parser_ = (htmlparser_ctx *)0x1071ad;
  ValidateInJavascript();
  HStack_d8.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x1071bc;
  HStack_d8.contextMap._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)phVar17;
  HStack_d8.parser_.parser_ = phVar13;
  bVar3 = StringToBool((string *)puVar14);
  p_Var19 = p_Var18[1]._M_left;
  HStack_d8.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x1071c7;
  iVar4 = ctemplate_htmlparser::htmlparser_is_js_quoted((htmlparser_ctx_s *)p_Var19);
  if (bVar3 == (iVar4 != 0)) {
    return;
  }
  HStack_d8.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x1071dd;
  ValidateJavascriptQuoted();
  pHVar16 = (HtmlparserCppTest *)p_Var19[1]._M_left;
  HStack_d8.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = p_Var18;
  HStack_d8.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)this;
  iVar4 = ctemplate_htmlparser::htmlparser_js_state((htmlparser_ctx_s *)pHVar16);
  puVar15 = kJavascriptStateMap;
  pHVar7 = (HtmlparserCppTest *)IdToName(pHVar16,(IdNameMap *)kJavascriptStateMap,iVar4);
  if (*(long *)&(((HtmlparserCppTest *)puVar14)->contextMap)._M_t._M_impl.super__Rb_tree_header.
                _M_header == 0) {
    ValidateJavascriptState();
  }
  else {
    this = (HtmlparserCppTest *)&pHStack_e8;
    std::__cxx11::string::string((string *)this,(char *)pHVar7,&aStack_e9);
    sVar2 = *(size_t *)
             &(((HtmlparserCppTest *)puVar14)->contextMap)._M_t._M_impl.super__Rb_tree_header.
              _M_header;
    puVar15 = (undefined1 *)pHVar7;
    if (sVar2 == sStack_e0) {
      if (sVar2 == 0) {
        bVar3 = true;
      }
      else {
        puVar15 = (undefined1 *)pHStack_e8;
        iVar4 = bcmp(*(pointer *)&(((HtmlparserCppTest *)puVar14)->contextMap)._M_t._M_impl,
                     pHStack_e8,sVar2);
        bVar3 = iVar4 == 0;
      }
    }
    else {
      bVar3 = false;
    }
    if (pHStack_e8 != &HStack_d8) {
      operator_delete(pHStack_e8);
    }
    pHVar16 = pHStack_e8;
    if (bVar3) {
      return;
    }
  }
  ValidateJavascriptState();
  bVar3 = StringToBool((string *)puVar15);
  p_Var18 = (_Base_ptr)(pHVar16->parser_).parser_;
  iVar4 = ctemplate_htmlparser::htmlparser_in_css((htmlparser_ctx_s *)p_Var18);
  if (bVar3 == (iVar4 != 0)) {
    return;
  }
  ValidateInCss();
  pHVar7 = (HtmlparserCppTest *)&pcStack_130;
  HStack_128.parser_ = (htmlparser_ctx *)pHVar16;
  if (*(long *)&(((HtmlparserCppTest *)puVar15)->contextMap)._M_t._M_impl.super__Rb_tree_header.
                _M_header == 0) {
    bVar3 = false;
    p_Var19 = p_Var18;
  }
  else {
    p_Stack_138 = (_Base_ptr)0x1072b8;
    pcStack_130 = extraout_RAX;
    unaff_R15 = (_Base_ptr)__errno_location();
    unaff_R15->_M_color = _S_red;
    p_Var19 = *(_Base_ptr *)&(((HtmlparserCppTest *)puVar15)->contextMap)._M_t._M_impl;
    p_Stack_138 = (_Base_ptr)0x1072d4;
    this = (HtmlparserCppTest *)strtol((char *)p_Var19,&pcStack_130,10);
    puVar15 = (undefined1 *)pHVar7;
    if (*pcStack_130 == '\0') {
      bVar3 = unaff_R15->_M_color == _S_red;
      unaff_R12 = (_Base_ptr)&pcStack_130;
    }
    else {
      bVar3 = false;
      unaff_R12 = (_Base_ptr)&pcStack_130;
    }
  }
  if (bVar3) {
    p_Var19 = p_Var18[1]._M_left;
    p_Stack_138 = (_Base_ptr)0x1072fc;
    iVar4 = ctemplate_htmlparser::htmlparser_get_line_number((htmlparser_ctx_s *)p_Var19);
    if ((int)this == iVar4) {
      return;
    }
  }
  else {
    p_Stack_138 = (_Base_ptr)0x107312;
    ValidateLine();
  }
  p_Stack_138 = (_Base_ptr)0x107317;
  ValidateLine();
  p_Stack_138 = unaff_R15;
  pHStack_140 = this;
  p_Stack_148 = unaff_R12;
  auStack_158._8_8_ = p_Var18;
  pHVar16 = (HtmlparserCppTest *)auStack_158;
  auStack_158._0_8_ = extraout_RAX_00;
  if (*(long *)&(((HtmlparserCppTest *)puVar15)->contextMap)._M_t._M_impl.super__Rb_tree_header.
                _M_header == 0) {
    bVar3 = false;
    p_Var18 = p_Var19;
  }
  else {
    p_Stack_160 = (_Base_ptr)0x107332;
    unaff_R15 = (_Base_ptr)__errno_location();
    unaff_R15->_M_color = _S_red;
    p_Var18 = *(_Base_ptr *)&(((HtmlparserCppTest *)puVar15)->contextMap)._M_t._M_impl;
    p_Stack_160 = (_Base_ptr)0x10734e;
    this = (HtmlparserCppTest *)strtol((char *)p_Var18,(char **)auStack_158,10);
    puVar15 = (undefined1 *)pHVar16;
    if (*(char *)auStack_158._0_8_ == '\0') {
      bVar3 = unaff_R15->_M_color == _S_red;
      unaff_R12 = (_Base_ptr)auStack_158;
    }
    else {
      bVar3 = false;
      unaff_R12 = (_Base_ptr)auStack_158;
    }
  }
  if (bVar3) {
    p_Var18 = p_Var19[1]._M_left;
    p_Stack_160 = (_Base_ptr)0x107376;
    iVar4 = ctemplate_htmlparser::htmlparser_get_column_number((htmlparser_ctx_s *)p_Var18);
    if ((int)this == iVar4) {
      return;
    }
  }
  else {
    p_Stack_160 = (_Base_ptr)0x10738c;
    ValidateColumn();
  }
  p_Stack_160 = (_Base_ptr)0x107391;
  ValidateColumn();
  p_Stack_160 = unaff_R15;
  pHStack_168 = this;
  p_Stack_170 = unaff_R12;
  auStack_180._8_8_ = p_Var19;
  pHVar16 = (HtmlparserCppTest *)auStack_180;
  auStack_180._0_8_ = extraout_RAX_01;
  if (*(long *)&(((HtmlparserCppTest *)puVar15)->contextMap)._M_t._M_impl.super__Rb_tree_header.
                _M_header == 0) {
    bVar3 = false;
    p_Var19 = p_Var18;
  }
  else {
    piVar8 = __errno_location();
    *piVar8 = 0;
    p_Var19 = *(_Base_ptr *)&(((HtmlparserCppTest *)puVar15)->contextMap)._M_t._M_impl;
    this = (HtmlparserCppTest *)strtol((char *)p_Var19,(char **)auStack_180,10);
    puVar15 = (undefined1 *)pHVar16;
    if (*(char *)auStack_180._0_8_ == '\0') {
      bVar3 = *piVar8 == 0;
      unaff_R12 = (_Base_ptr)auStack_180;
    }
    else {
      bVar3 = false;
      unaff_R12 = (_Base_ptr)auStack_180;
    }
  }
  if (bVar3) {
    p_Var19 = p_Var18[1]._M_left;
    iVar4 = ctemplate_htmlparser::htmlparser_value_index((htmlparser_ctx_s *)p_Var19);
    if ((int)this == iVar4) {
      return;
    }
  }
  else {
    ValidateValueIndex();
  }
  ValidateValueIndex();
  bVar3 = StringToBool((string *)puVar15);
  pHVar16 = (HtmlparserCppTest *)p_Var19[1]._M_left;
  iVar4 = ctemplate_htmlparser::htmlparser_is_url_start((htmlparser_ctx_s *)pHVar16);
  if (bVar3 == (iVar4 != 0)) {
    return;
  }
  ValidateIsUrlStart();
  vStack_1e0.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_1e0.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_1e0.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Stack_1c8 = p_Var19;
  p_Stack_1c0 = unaff_R12;
  SplitStringIntoKeyValuePairs((string *)puVar15,"=",",",&vStack_1e0);
  if (vStack_1e0.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      vStack_1e0.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    p_Var1 = &(pHVar16->contextMap)._M_t._M_impl.super__Rb_tree_header;
    str_00 = vStack_1e0.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      StripWhiteSpace(&str_00->first);
      str = &str_00->second;
      StripWhiteSpace(str);
      iVar4 = std::__cxx11::string::compare((char *)str_00);
      if (iVar4 == 0) {
        ValidateState(pHVar16,str);
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)str_00);
        if (iVar4 == 0) {
          ValidateTag(pHVar16,str);
        }
        else {
          iVar4 = std::__cxx11::string::compare((char *)str_00);
          if (iVar4 == 0) {
            ValidateAttribute(pHVar16,str);
          }
          else {
            iVar4 = std::__cxx11::string::compare((char *)str_00);
            if (iVar4 == 0) {
              ValidateValue(pHVar16,str);
            }
            else {
              iVar4 = std::__cxx11::string::compare((char *)str_00);
              if (iVar4 == 0) {
                ValidateAttributeType(pHVar16,str);
              }
              else {
                iVar4 = std::__cxx11::string::compare((char *)str_00);
                if (iVar4 == 0) {
                  ValidateAttributeQuoted(pHVar16,str);
                }
                else {
                  iVar4 = std::__cxx11::string::compare((char *)str_00);
                  if (iVar4 == 0) {
                    ValidateInJavascript(pHVar16,str);
                  }
                  else {
                    iVar4 = std::__cxx11::string::compare((char *)str_00);
                    if (iVar4 == 0) {
                      ValidateJavascriptQuoted(pHVar16,str);
                    }
                    else {
                      iVar4 = std::__cxx11::string::compare((char *)str_00);
                      if (iVar4 == 0) {
                        ValidateJavascriptState(pHVar16,str);
                      }
                      else {
                        iVar4 = std::__cxx11::string::compare((char *)str_00);
                        if (iVar4 == 0) {
                          ValidateInCss(pHVar16,str);
                        }
                        else {
                          iVar4 = std::__cxx11::string::compare((char *)str_00);
                          if (iVar4 == 0) {
                            ValidateLine(pHVar16,str);
                          }
                          else {
                            iVar4 = std::__cxx11::string::compare((char *)str_00);
                            if (iVar4 == 0) {
                              ValidateColumn(pHVar16,str);
                            }
                            else {
                              iVar4 = std::__cxx11::string::compare((char *)str_00);
                              if (iVar4 == 0) {
                                ValidateValueIndex(pHVar16,str);
                              }
                              else {
                                iVar4 = std::__cxx11::string::compare((char *)str_00);
                                if (iVar4 == 0) {
                                  ValidateIsUrlStart(pHVar16,str);
                                }
                                else {
                                  iVar4 = std::__cxx11::string::compare((char *)str_00);
                                  if (iVar4 == 0) {
                                    cVar9 = std::
                                            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                            ::find((
                                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                  *)pHVar16,str);
                                    if ((_Rb_tree_header *)cVar9._M_node == p_Var1) {
                                      this_00 = (HtmlParser *)operator_new(8);
                                      HtmlParser::HtmlParser(this_00);
                                      ppHVar10 = std::
                                                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                 ::operator[](&pHVar16->contextMap,str);
                                      *ppHVar10 = this_00;
                                    }
                                    ppHVar10 = std::
                                               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                               ::operator[](&pHVar16->contextMap,str);
                                    HtmlParser::CopyFrom(*ppHVar10,&pHVar16->parser_);
                                  }
                                  else {
                                    iVar4 = std::__cxx11::string::compare((char *)str_00);
                                    if (iVar4 == 0) {
                                      cVar9 = std::
                                              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                              ::find((
                                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                  *)pHVar16,str);
                                      if ((_Rb_tree_header *)cVar9._M_node == p_Var1) {
                                        ProcessAnnotation();
LAB_0010784b:
                                        ProcessAnnotation();
                                        std::
                                        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        ::~vector(&vStack_1e0);
                                        _Unwind_Resume(extraout_RAX_02);
                                      }
                                      ppHVar10 = std::
                                                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                 ::operator[](&pHVar16->contextMap,str);
                                      HtmlParser::CopyFrom(&pHVar16->parser_,*ppHVar10);
                                    }
                                    else {
                                      iVar4 = std::__cxx11::string::compare((char *)str_00);
                                      if (iVar4 == 0) {
                                        bVar3 = StringToBool(str);
                                        if (bVar3) {
                                          ctemplate_htmlparser::htmlparser_reset
                                                    ((pHVar16->parser_).parser_);
                                        }
                                      }
                                      else {
                                        this_01 = str_00;
                                        iVar4 = std::__cxx11::string::compare((char *)str_00);
                                        if (iVar4 == 0) {
                                          iVar4 = NameToId((HtmlparserCppTest *)this_01,
                                                           (IdNameMap *)kResetModeMap,str);
                                          ctemplate_htmlparser::htmlparser_reset_mode
                                                    ((pHVar16->parser_).parser_,iVar4);
                                        }
                                        else {
                                          iVar4 = std::__cxx11::string::compare((char *)str_00);
                                          if (iVar4 != 0) goto LAB_0010784b;
                                          bVar3 = StringToBool(str);
                                          if (bVar3) {
                                            ctemplate_htmlparser::htmlparser_insert_text
                                                      ((pHVar16->parser_).parser_);
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      str_00 = str_00 + 1;
    } while (str_00 != vStack_1e0.
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&vStack_1e0);
  return;
}

Assistant:

void HtmlparserCppTest::ValidateValue(const string &expected_value) {
  EXPECT_TRUE(parser_.value() != NULL);
  const string parsed_state(parser_.value());
  EXPECT_EQ(expected_value, parsed_state)
      << "Unexpected value at line " << parser_.line_number();
}